

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

FunctionData * __thiscall
inja::FunctionStorage::get_or_new(FunctionStorage *this,string_view name,uint num_args)

{
  uint uVar1;
  bool bVar2;
  mapped_type *this_00;
  reference pFVar3;
  reference pvVar4;
  FunctionData *i;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  mapped_type *local_38;
  mapped_type *vec;
  FunctionStorage *pFStack_28;
  uint num_args_local;
  FunctionStorage *this_local;
  string_view name_local;
  
  name_local.data_ = (const_pointer)name.size_;
  this_local = (FunctionStorage *)name.data_;
  vec._4_4_ = num_args;
  pFStack_28 = this;
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&local_58,(basic_string_view *)&this_local);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
            ::operator[](&this->m_map,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_38 = this_00;
  __end2 = std::
           vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
           ::begin(this_00);
  i = (FunctionData *)
      std::
      vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
      ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<inja::FunctionStorage::FunctionData_*,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>
                                *)&i);
    if (!bVar2) {
      std::
      vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
      ::emplace_back<>(local_38);
      uVar1 = vec._4_4_;
      pvVar4 = std::
               vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
               ::back(local_38);
      pvVar4->num_args = uVar1;
      pvVar4 = std::
               vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
               ::back(local_38);
      return pvVar4;
    }
    pFVar3 = __gnu_cxx::
             __normal_iterator<inja::FunctionStorage::FunctionData_*,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>
             ::operator*(&__end2);
    if (pFVar3->num_args == vec._4_4_) break;
    __gnu_cxx::
    __normal_iterator<inja::FunctionStorage::FunctionData_*,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>
    ::operator++(&__end2);
  }
  return pFVar3;
}

Assistant:

FunctionData& get_or_new(nonstd::string_view name, unsigned int num_args) {
		auto& vec = m_map[static_cast<std::string>(name)];
		for (auto& i : vec) {
			if (i.num_args == num_args) return i;
		}
		vec.emplace_back();
		vec.back().num_args = num_args;
		return vec.back();
	}